

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O3

bool Peeps::IsJccOrShiftInstr(Instr *instr)

{
  OpCode OVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  
  if (instr->m_kind == InstrKindBranch) {
    OVar1 = instr->m_opcode;
    if (OVar1 < ADD) {
      if ((OVar1 != MultiBr) && (bVar3 = 1, OVar1 != Br)) goto LAB_0061daa3;
    }
    else {
      bVar2 = LowererMD::IsUnconditionalBranch(instr);
      bVar3 = 1;
      if (!bVar2) goto LAB_0061daa3;
    }
  }
  iVar4 = *(int *)&instr->m_opcode + -0x491;
  if ((ushort)iVar4 < 0x10) {
    bVar3 = (byte)(0xe001 >> ((byte)iVar4 & 0x1f));
  }
  else {
    bVar3 = 0;
  }
LAB_0061daa3:
  return (bool)(bVar3 & 1);
}

Assistant:

bool
Peeps::IsJccOrShiftInstr(IR::Instr *instr)
{
    bool instrFound = (instr->IsBranchInstr() && instr->AsBranchInstr()->IsConditional()) ||
        (instr->m_opcode == Js::OpCode::SHL) || (instr->m_opcode == Js::OpCode::SHR) || (instr->m_opcode == Js::OpCode::SAR);

#if defined(_M_X64)
    instrFound = instrFound || (instr->m_opcode == Js::OpCode::SHLD);
#endif

    return (instrFound);
}